

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O1

bool __thiscall
axl::zip::ZipReader::extractFileToFile(ZipReader *this,size_t index,StringRef *fileName)

{
  mz_zip_archive *pZip;
  mz_bool mVar1;
  C *pDst_filename;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  pZip = this->m_zip;
  if (fileName->m_length == 0) {
    pDst_filename = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pDst_filename =
         sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated(fileName);
  }
  mVar1 = mz_zip_reader_extract_to_file(pZip,(mz_uint)index,pDst_filename,0);
  if (mVar1 == 0) {
    err::Error::Error((Error *)&local_28,5);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return mVar1 != 0;
}

Assistant:

bool
ZipReader::extractFileToFile(
	size_t index,
	const sl::StringRef& fileName
) const {
	ASSERT(isOpen());

	mz_bool result = mz_zip_reader_extract_to_file(
		m_zip,
		index,
		fileName.sz(),
		0
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}